

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>,void>
               (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *container,ostream *os)

{
  pointer peVar1;
  long lVar2;
  pointer xfx;
  
  std::operator<<(os,'{');
  xfx = (container->
        super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
        )._M_impl.super__Vector_impl_data._M_start;
  peVar1 = (container->
           super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = 0;
  do {
    if (xfx == peVar1) {
      if (lVar2 != 0) {
LAB_00163712:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_00163712;
    }
    std::operator<<(os,' ');
    pstore::repo::operator<<(os,xfx);
    lVar2 = lVar2 + 1;
    xfx = xfx + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }